

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paladin.c
# Opt level: O1

void spell_rites_of_preparation(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  undefined2 uVar1;
  PC_DATA *pPVar2;
  short sVar3;
  bool bVar4;
  bool bVar5;
  short sVar6;
  CHAR_DATA *ach;
  AFFECT_DATA af;
  AFFECT_DATA local_90;
  
  sVar3 = (short)sn;
  bVar4 = is_affected(ch,sn);
  if (bVar4) {
    send_to_char("You cannot focus on preparing your party for battle again so soon.\n\r",ch);
    return;
  }
  ach = ch->in_room->people;
  if (ach != (CHAR_DATA *)0x0) {
    bVar4 = false;
    do {
      bVar5 = is_same_group(ach,ch);
      if ((ach != ch) && (bVar5)) {
        bVar5 = is_same_group(ach,ch);
        bVar4 = true;
        if ((bVar5) && ((bVar5 = is_npc(ach), !bVar5 && (bVar5 = is_affected(ach,sn), !bVar5)))) {
          pPVar2 = ach->pcdata;
          pPVar2->condition[2] = 0;
          pPVar2->condition[3] = 0;
          init_affect(&local_90);
          local_90.where = 0;
          local_90.level = ch->level;
          local_90.modifier = local_90.level / 7;
          local_90.duration = 0x18;
          local_90.location = 0x12;
          local_90.type = sVar3;
          affect_to_char(ach,&local_90);
          local_90.level = ch->level;
          local_90.modifier = local_90.level / 7;
          local_90.duration = 0x18;
          local_90.location = 0x13;
          local_90.type = sVar3;
          affect_to_char(ach,&local_90);
          uVar1 = ch->level;
          sVar6 = uVar1 + 7;
          if (-1 < (short)uVar1) {
            sVar6 = uVar1;
          }
          local_90.modifier = -(sVar6 >> 3);
          local_90.duration = 0x18;
          local_90.location = 0x14;
          local_90.aftype = 4;
          local_90.type = sVar3;
          local_90.level = uVar1;
          affect_to_char(ach,&local_90);
        }
      }
      ach = ach->next_in_room;
    } while (ach != (CHAR_DATA *)0x0);
    if (bVar4) {
      act("You recite some prayers to those in your party, bolstering their confidence and preparing them for battle."
          ,ch,(void *)0x0,(void *)0x0,3);
      act("$n recites some prayers in a loud and confident voice, preparing you for righteous battle."
          ,ch,(void *)0x0,(void *)0x0,6);
      init_affect(&local_90);
      local_90.where = 0;
      local_90.aftype = 7;
      local_90.level = ch->level;
      local_90.modifier = 0;
      local_90.duration = 0x30;
      local_90.location = 0;
      local_90.type = sVar3;
      affect_to_char(ch,&local_90);
      return;
    }
  }
  send_to_char("You need a party to perform these rites.\n\r",ch);
  return;
}

Assistant:

void spell_rites_of_preparation(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *to;
	AFFECT_DATA af;
	bool hasgroup= false;

	if (is_affected(ch, sn))
	{
		send_to_char("You cannot focus on preparing your party for battle again so soon.\n\r", ch);
		return;
	}

	for (to = ch->in_room->people; to != nullptr; to = to->next_in_room)
	{
		if (is_same_group(to, ch) && to != ch)
			hasgroup = true;
		else
			continue;

		if (is_same_group(to, ch) && !is_npc(to) && !is_affected(to, sn))
		{
			to->pcdata->condition[COND_HUNGER] = 0;
			to->pcdata->condition[COND_THIRST] = 0;

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.type = sn;
			af.modifier = (ch->level / 7);
			af.location = APPLY_HITROLL;
			af.duration = 24;
			af.level = ch->level;
			affect_to_char(to, &af);

			af.type = sn;
			af.modifier = (ch->level / 7);
			af.location = APPLY_DAMROLL;
			af.duration = 24;
			af.level = ch->level;
			affect_to_char(to, &af);

			af.type = sn;
			af.modifier = -(ch->level / 8);
			af.location = APPLY_SAVES;
			af.duration = 24;
			af.aftype = AFT_COMMUNE;
			af.level = ch->level;
			affect_to_char(to, &af);
		}
	}

	if (hasgroup == false)
	{
		send_to_char("You need a party to perform these rites.\n\r", ch);
		return;
	}
	else
	{
		act("You recite some prayers to those in your party, bolstering their confidence and preparing them for battle.", ch, 0, 0, TO_CHAR);
		act("$n recites some prayers in a loud and confident voice, preparing you for righteous battle.", ch, 0, 0, TO_GROUP);

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = sn;
		af.aftype = AFT_TIMER;
		af.level = ch->level;
		af.location = APPLY_NONE;
		af.modifier = 0;
		af.duration = 48;
		affect_to_char(ch, &af);
	}
}